

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

void __thiscall soplex::SPxSteepPR<double>::entered4(SPxSteepPR<double> *this,SPxId param_1,int n)

{
  int iVar1;
  SPxSolverBase<double> *pSVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  UpdateVector<double> *pUVar6;
  pointer pdVar7;
  UpdateVector<double> *pUVar8;
  pointer pdVar9;
  SVSetBase<double> *pSVar10;
  double *pdVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  if ((-1 < n) &&
     (pSVar2 = (this->super_SPxPricer<double>).thesolver, n < (pSVar2->thecovectors->set).thenum)) {
    dVar17 = 1.0 / (double)(pSVar2->super_SPxBasisBase<double>).iterCount + 2.0;
    pdVar3 = (pSVar2->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (pSVar2->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workVec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pUVar6 = pSVar2->thePvec;
    pdVar7 = (pUVar6->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pUVar8 = pSVar2->theCoPvec;
    pdVar9 = (pUVar8->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar16 = 1.0 / (pSVar2->theFvec->thedelta).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(uint)n];
    for (uVar12 = (ulong)(uint)(pUVar8->thedelta).super_IdxSet.num; 0 < (int)uVar12;
        uVar12 = uVar12 - 1) {
      iVar1 = (pUVar8->thedelta).super_IdxSet.idx[uVar12 - 1];
      dVar13 = pdVar9[iVar1] * dVar16;
      dVar14 = pdVar5[iVar1];
      dVar13 = (this->pi_p * dVar13 - (dVar14 + dVar14)) * dVar13 + pdVar3[iVar1];
      pdVar3[iVar1] = dVar13;
      dVar14 = dVar17;
      if (dVar13 < dVar17) {
LAB_001ccf8c:
        pdVar3[iVar1] = dVar14;
      }
      else {
        pdVar11 = (double *)infinity();
        if (*pdVar11 <= dVar13 && dVar13 != *pdVar11) {
          dVar14 = SPxSolverBase<double>::epsilon((this->super_SPxPricer<double>).thesolver);
          dVar14 = 1.0 / dVar14;
          goto LAB_001ccf8c;
        }
      }
    }
    for (uVar12 = (ulong)(uint)(pUVar6->thedelta).super_IdxSet.num; 0 < (int)uVar12;
        uVar12 = uVar12 - 1) {
      iVar1 = (pUVar6->thedelta).super_IdxSet.idx[uVar12 - 1];
      dVar13 = pdVar7[iVar1] * dVar16;
      dVar14 = this->pi_p;
      pSVar10 = ((this->super_SPxPricer<double>).thesolver)->thevectors;
      dVar15 = SVectorBase<double>::operator*
                         ((SVectorBase<double> *)
                          ((pSVar10->set).theitem + (pSVar10->set).thekey[iVar1].idx),
                          &(this->workVec).super_VectorBase<double>);
      dVar13 = (dVar14 * dVar13 - (dVar15 + dVar15)) * dVar13 + pdVar4[iVar1];
      pdVar4[iVar1] = dVar13;
      dVar14 = dVar17;
      if (dVar13 < dVar17) {
LAB_001cd05f:
        pdVar4[iVar1] = dVar14;
      }
      else {
        pdVar11 = (double *)infinity();
        if (*pdVar11 <= dVar13 && dVar13 != *pdVar11) {
          dVar14 = SPxSolverBase<double>::epsilon((this->super_SPxPricer<double>).thesolver);
          dVar14 = 1.0 / dVar14;
          goto LAB_001cd05f;
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::entered4(SPxId /* id */, int n)
{
   assert(this->thesolver->type() == SPxSolverBase<R>::ENTER);

   if(n >= 0 && n < this->thesolver->dim())
   {
      R delta = 2 + 1.0 / this->thesolver->basis().iteration();
      R* coWeights_ptr = this->thesolver->coWeights.get_ptr();
      R* weights_ptr = this->thesolver->weights.get_ptr();
      const R* workVec_ptr = workVec.get_const_ptr();
      const R* pVec = this->thesolver->pVec().delta().values();
      const IdxSet& pIdx = this->thesolver->pVec().idx();
      const R* coPvec = this->thesolver->coPvec().delta().values();
      const IdxSet& coPidx = this->thesolver->coPvec().idx();
      R xi_p = 1 / this->thesolver->fVec().delta()[n];
      int i, j;
      R xi_ip;

      assert(this->thesolver->fVec().delta()[n] > this->thesolver->epsilon()
             || this->thesolver->fVec().delta()[n] < -this->thesolver->epsilon());

      for(j = coPidx.size() - 1; j >= 0; --j)
      {
         i = coPidx.index(j);
         xi_ip = xi_p * coPvec[i];
         coWeights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * workVec_ptr[i]);

         /*
           if(coWeights_ptr[i] < 1)
           coWeights_ptr[i] = 1 / (2-x);
         */
         if(coWeights_ptr[i] < delta)
            coWeights_ptr[i] = delta;
         // coWeights_ptr[i] = 1;
         else if(coWeights_ptr[i] > R(infinity))
            coWeights_ptr[i] = 1 / this->thesolver->epsilon();
      }

      for(j = pIdx.size() - 1; j >= 0; --j)
      {
         i = pIdx.index(j);
         xi_ip = xi_p * pVec[i];
         weights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * (this->thesolver->vector(i) * workVec));

         /*
           if(weights_ptr[i] < 1)
           weights_ptr[i] = 1 / (2-x);
         */
         if(weights_ptr[i] < delta)
            weights_ptr[i] = delta;
         // weights_ptr[i] = 1;
         else if(weights_ptr[i] > R(infinity))
            weights_ptr[i] = 1.0 / this->thesolver->epsilon();
      }
   }

   /*@
     if(this->thesolver->isId(id))
     weights[   this->thesolver->number(id) ] *= 1.0001;
     else if(this->thesolver->isCoId(id))
     coWeights[ this->thesolver->number(id) ] *= 1.0001;
   */

}